

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O2

CURLcode Curl_is_connected(connectdata *conn,int sockindex,_Bool *connected)

{
  SessionHandle *data;
  undefined8 uVar1;
  int iVar2;
  _Bool _Var3;
  uint uVar4;
  CURLcode CVar5;
  long lVar6;
  int *piVar7;
  char *pcVar8;
  ulong uVar9;
  long lVar10;
  int error;
  int local_a0;
  CURLcode local_9c;
  timeval local_98;
  _Bool *local_88;
  long local_80;
  ulong local_78;
  ulong local_70;
  char ipaddress [46];
  
  data = conn->data;
  error = 0;
  *connected = false;
  if ((conn->bits).tcpconnect[sockindex] == true) {
    *connected = true;
LAB_004fcf3e:
    CVar5 = CURLE_OK;
  }
  else {
    local_a0 = sockindex;
    local_98 = curlx_tvnow();
    local_78 = Curl_timeleft(data,&local_98,true);
    if ((long)local_78 < 0) {
      Curl_failf(data,"Connection time-out");
      CVar5 = CURLE_OPERATION_TIMEDOUT;
    }
    else {
      local_9c = CURLE_OK;
      local_88 = connected;
      local_80 = (long)sockindex;
      for (lVar10 = 0; lVar10 != 2; lVar10 = lVar10 + 1) {
        if (conn->tempsock[lVar10] != -1) {
          uVar4 = Curl_socket_check(-1,-1,conn->tempsock[lVar10],0);
          uVar9 = (ulong)((uint)lVar10 ^ 1);
          if (uVar4 == 2) {
            _Var3 = verifyconnect(conn->tempsock[lVar10],&error);
            lVar6 = local_80;
            if (_Var3) {
              conn->sock[local_80] = conn->tempsock[lVar10];
              conn->ip_addr = conn->tempaddr[lVar10];
              conn->tempsock[lVar10] = -1;
              if (conn->tempsock[uVar9] != -1) {
                Curl_closesocket(conn,conn->tempsock[uVar9]);
                conn->tempsock[uVar9] = -1;
              }
              CVar5 = Curl_connected_proxy(conn,local_a0);
              if (CVar5 != CURLE_OK) {
                return CVar5;
              }
              (conn->bits).tcpconnect[lVar6] = true;
              *local_88 = true;
              if (local_a0 == 0) {
                Curl_pgrsTime(data,TIMER_CONNECT);
              }
              Curl_updateconninfo(conn,conn->sock[lVar6]);
              Curl_verboseconnect(conn);
              goto LAB_004fcf3e;
            }
            Curl_infof(data,"Connection failed\n");
          }
          else if (uVar4 == 0) {
            lVar6 = curlx_tvdiff(local_98,conn->connecttime);
            if (conn->timeoutms_per_addr <= lVar6) {
              Curl_infof(data,"After %ldms connect time, move on!\n");
              error = 0x6e;
            }
            if (((lVar10 == 0) && (conn->tempaddr[1] == (Curl_addrinfo *)0x0)) &&
               (lVar6 = curlx_tvdiff(local_98,conn->connecttime), 199 < lVar6)) {
              trynextip(conn,local_a0,1);
            }
          }
          else if ((uVar4 & 4) != 0) {
            verifyconnect(conn->tempsock[lVar10],&error);
          }
          iVar2 = error;
          if (error != 0) {
            (data->state).os_errno = error;
            piVar7 = __errno_location();
            *piVar7 = iVar2;
            if (conn->tempaddr[lVar10] != (Curl_addrinfo *)0x0) {
              local_70 = uVar9;
              Curl_printable_address(conn->tempaddr[lVar10],ipaddress,0x2e);
              lVar6 = conn->port;
              pcVar8 = Curl_strerror(conn,error);
              Curl_infof(data,"connect to %s port %ld failed: %s\n",ipaddress,lVar6,pcVar8);
              conn->timeoutms_per_addr =
                   local_78 >> (conn->tempaddr[lVar10]->ai_next != (Curl_addrinfo *)0x0);
              CVar5 = trynextip(conn,local_a0,(uint)lVar10);
              if ((CVar5 != CURLE_COULDNT_CONNECT) || (conn->tempsock[local_70] == -1)) {
                local_9c = CVar5;
              }
            }
          }
        }
      }
      CVar5 = CURLE_OK;
      if ((local_9c != CURLE_OK) &&
         ((conn->tempaddr[1] != (Curl_addrinfo *)0x0 ||
          (local_9c = trynextip(conn,local_a0,1), local_9c != CURLE_OK)))) {
        uVar1 = *(undefined8 *)(conn->primary_ip + (ulong)(conn->bits).proxy * 0x20 + -0x3c);
        lVar10 = conn->port;
        pcVar8 = Curl_strerror(conn,error);
        Curl_failf(data,"Failed to connect to %s port %ld: %s",uVar1,lVar10,pcVar8);
        CVar5 = local_9c;
      }
    }
  }
  return CVar5;
}

Assistant:

CURLcode Curl_is_connected(struct connectdata *conn,
                           int sockindex,
                           bool *connected)
{
  struct SessionHandle *data = conn->data;
  CURLcode result = CURLE_OK;
  long allow;
  int error = 0;
  struct timeval now;
  int rc;
  int i;

  DEBUGASSERT(sockindex >= FIRSTSOCKET && sockindex <= SECONDARYSOCKET);

  *connected = FALSE; /* a very negative world view is best */

  if(conn->bits.tcpconnect[sockindex]) {
    /* we are connected already! */
    *connected = TRUE;
    return CURLE_OK;
  }

  now = Curl_tvnow();

  /* figure out how long time we have left to connect */
  allow = Curl_timeleft(data, &now, TRUE);

  if(allow < 0) {
    /* time-out, bail out, go home */
    failf(data, "Connection time-out");
    return CURLE_OPERATION_TIMEDOUT;
  }

  for(i=0; i<2; i++) {
    const int other = i ^ 1;
    if(conn->tempsock[i] == CURL_SOCKET_BAD)
      continue;

#ifdef mpeix
    /* Call this function once now, and ignore the results. We do this to
       "clear" the error state on the socket so that we can later read it
       reliably. This is reported necessary on the MPE/iX operating system. */
    (void)verifyconnect(conn->tempsock[i], NULL);
#endif

    /* check socket for connect */
    rc = Curl_socket_ready(CURL_SOCKET_BAD, conn->tempsock[i], 0);

    if(rc == 0) { /* no connection yet */
      if(curlx_tvdiff(now, conn->connecttime) >= conn->timeoutms_per_addr) {
        infof(data, "After %ldms connect time, move on!\n",
              conn->timeoutms_per_addr);
        error = ETIMEDOUT;
      }

      /* should we try another protocol family? */
      if(i == 0 && conn->tempaddr[1] == NULL &&
         curlx_tvdiff(now, conn->connecttime) >= HAPPY_EYEBALLS_TIMEOUT) {
        trynextip(conn, sockindex, 1);
      }
    }
    else if(rc == CURL_CSELECT_OUT) {
      if(verifyconnect(conn->tempsock[i], &error)) {
        /* we are connected with TCP, awesome! */

        /* use this socket from now on */
        conn->sock[sockindex] = conn->tempsock[i];
        conn->ip_addr = conn->tempaddr[i];
        conn->tempsock[i] = CURL_SOCKET_BAD;

        /* close the other socket, if open */
        if(conn->tempsock[other] != CURL_SOCKET_BAD) {
          Curl_closesocket(conn, conn->tempsock[other]);
          conn->tempsock[other] = CURL_SOCKET_BAD;
        }

        /* see if we need to do any proxy magic first once we connected */
        result = Curl_connected_proxy(conn, sockindex);
        if(result)
          return result;

        conn->bits.tcpconnect[sockindex] = TRUE;

        *connected = TRUE;
        if(sockindex == FIRSTSOCKET)
          Curl_pgrsTime(data, TIMER_CONNECT); /* connect done */
        Curl_updateconninfo(conn, conn->sock[sockindex]);
        Curl_verboseconnect(conn);

        return CURLE_OK;
      }
      else
        infof(data, "Connection failed\n");
    }
    else if(rc & CURL_CSELECT_ERR)
      (void)verifyconnect(conn->tempsock[i], &error);

    /*
     * The connection failed here, we should attempt to connect to the "next
     * address" for the given host. But first remember the latest error.
     */
    if(error) {
      data->state.os_errno = error;
      SET_SOCKERRNO(error);
      if(conn->tempaddr[i]) {
        CURLcode status;
        char ipaddress[MAX_IPADR_LEN];
        Curl_printable_address(conn->tempaddr[i], ipaddress, MAX_IPADR_LEN);
        infof(data, "connect to %s port %ld failed: %s\n",
              ipaddress, conn->port, Curl_strerror(conn, error));

        conn->timeoutms_per_addr = conn->tempaddr[i]->ai_next == NULL ?
                                   allow : allow / 2;

        status = trynextip(conn, sockindex, i);
        if(status != CURLE_COULDNT_CONNECT
            || conn->tempsock[other] == CURL_SOCKET_BAD)
          /* the last attempt failed and no other sockets remain open */
          result = status;
      }
    }
  }

  if(result) {
    /* no more addresses to try */

    /* if the first address family runs out of addresses to try before
       the happy eyeball timeout, go ahead and try the next family now */
    if(conn->tempaddr[1] == NULL) {
      result = trynextip(conn, sockindex, 1);
      if(!result)
        return result;
    }

    failf(data, "Failed to connect to %s port %ld: %s",
          conn->bits.proxy?conn->proxy.name:conn->host.name,
          conn->port, Curl_strerror(conn, error));
  }

  return result;
}